

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O2

Client * __thiscall
capnproto_test::capnp::test::TestInterface::GetTestMoreStuffResults::Pipeline::getCap
          (Client *__return_storage_ptr__,Pipeline *this)

{
  undefined8 uVar1;
  undefined1 local_48 [56];
  
  ::capnp::AnyPointer::Pipeline::getPointerField((Pipeline *)(local_48 + 0x10),&this->_typeless,0);
  ::capnp::AnyPointer::Pipeline::asCap((Pipeline *)local_48);
  uVar1 = local_48._8_8_;
  local_48._8_8_ = (ClientHook *)0x0;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = local_48._0_8_;
  *(undefined8 *)&__return_storage_ptr__->field_0x10 = uVar1;
  *(pointer_____offset_0x10___ **)__return_storage_ptr__ = &TestMoreStuff::Client::typeinfo;
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)local_48);
  ::capnp::AnyPointer::Pipeline::~Pipeline((Pipeline *)(local_48 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnproto_test::capnp::test::TestMoreStuff::Client TestInterface::GetTestMoreStuffResults::Pipeline::getCap() {
  return  ::capnproto_test::capnp::test::TestMoreStuff::Client(_typeless.getPointerField(0).asCap());
}